

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReader::getPixel
          (PtexReader *this,int faceid,int u,int v,float *result,int firstchan,int nchannelsArg)

{
  _func_int *p_Var1;
  long lVar2;
  PtexPtr<Ptex::v2_4::PtexFaceData> *this_00;
  PtexReader *pPVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  DataType dt;
  undefined4 extraout_var;
  PtexFaceData *pPVar7;
  undefined8 uStack_90;
  float *local_88;
  undefined8 local_80;
  DataType local_78;
  DataType local_74;
  int local_70;
  DataType local_6c;
  PtexPtr<Ptex::v2_4::PtexFaceData> *local_68;
  PtexFaceData *local_60;
  PtexReader *local_58;
  int local_50;
  int datasize;
  void *local_40;
  void *pixel;
  PtexPtr<Ptex::v2_4::PtexFaceData> data;
  int firstchan_local;
  float *result_local;
  int v_local;
  int u_local;
  int faceid_local;
  PtexReader *this_local;
  
  uStack_90 = 0xaafb6e;
  local_58 = this;
  data._ptr._4_4_ = firstchan;
  memset(result,0,(long)nchannelsArg << 2);
  uStack_90 = 0xaafb84;
  iVar5 = PtexUtils::min<int>(nchannelsArg,(uint)(local_58->_header).nchannels - data._ptr._4_4_);
  if (0 < iVar5) {
    uStack_90 = 0xaafba5;
    iVar6 = (*(local_58->super_PtexTexture)._vptr_PtexTexture[0x13])(local_58,(ulong)(uint)faceid);
    local_68 = (PtexPtr<Ptex::v2_4::PtexFaceData> *)&pixel;
    uStack_90 = 0xaafbb5;
    PtexPtr<Ptex::v2_4::PtexFaceData>::PtexPtr
              (local_68,(PtexFaceData *)CONCAT44(extraout_var,iVar6));
    this_00 = local_68;
    lVar2 = -((long)local_58->_pixelsize + 0xfU & 0xfffffffffffffff0);
    local_40 = (void *)((long)&local_88 + lVar2);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafbde;
    pPVar7 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(this_00);
    pvVar4 = local_40;
    p_Var1 = pPVar7->_vptr_PtexFaceData[5];
    local_60 = pPVar7;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafbfb;
    (*p_Var1)(pPVar7,(ulong)(uint)u,(ulong)(uint)v,pvVar4);
    pPVar3 = local_58;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafc06;
    dt = datatype(pPVar3);
    local_6c = dt;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafc13;
    local_70 = DataSize(dt);
    pPVar3 = local_58;
    if (data._ptr._4_4_ != 0) {
      local_40 = (void *)((long)local_40 + (long)(local_70 * data._ptr._4_4_));
    }
    local_50 = local_70;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafc5b;
    local_74 = datatype(pPVar3);
    pvVar4 = local_40;
    pPVar3 = local_58;
    if (local_74 == dt_float) {
      iVar5 = local_50 * iVar5;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafc7f;
      memcpy(result,pvVar4,(long)iVar5);
    }
    else {
      local_80 = local_40;
      local_88 = result;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafc9a;
      local_78 = datatype(pPVar3);
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafcb2;
      ConvertToFloat(*(float **)((long)&local_70 + lVar2),*(void **)((long)&local_78 + lVar2),
                     *(DataType *)((long)&local_80 + lVar2 + 4),*(int *)((long)&local_80 + lVar2));
    }
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xaafcbf;
    PtexPtr<Ptex::v2_4::PtexFaceData>::~PtexPtr
              (*(PtexPtr<Ptex::v2_4::PtexFaceData> **)((long)&local_80 + lVar2));
  }
  return;
}

Assistant:

void PtexReader::getPixel(int faceid, int u, int v,
                          float* result, int firstchan, int nchannelsArg)
{
    memset(result, 0, sizeof(*result)*nchannelsArg);

    // clip nchannels against actual number available
    nchannelsArg = PtexUtils::min(nchannelsArg, _header.nchannels-firstchan);
    if (nchannelsArg <= 0) return;

    // get raw pixel data
    PtexPtr<PtexFaceData> data ( getData(faceid) );
    void* pixel = alloca(_pixelsize);
    data->getPixel(u, v, pixel);

    // adjust for firstchan offset
    int datasize = DataSize(datatype());
    if (firstchan)
        pixel = (char*) pixel + datasize * firstchan;

    // convert/copy to result as needed
    if (datatype() == dt_float)
        memcpy(result, pixel, datasize * nchannelsArg);
    else
        ConvertToFloat(result, pixel, datatype(), nchannelsArg);
}